

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void do_storms(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_20;
  int count;
  int diry;
  int dirx;
  int y;
  int x;
  int nstrike;
  
  if (((*(uint *)&(level->flags).field_0x8 >> 0x12 & 1) != 0) && (iVar1 = rn2(8), iVar1 == 0)) {
    for (y = rnd(0x40); y < 0x41; y = y << 1) {
      local_20 = 0;
      do {
        iVar1 = rnd(0x4f);
        iVar2 = rn2(0x15);
        local_20 = local_20 + 1;
        bVar5 = false;
        if (local_20 < 100) {
          bVar5 = level->locations[iVar1][iVar2].typ != '&';
        }
      } while (bVar5);
      if (local_20 < 100) {
        iVar3 = rn2(3);
        iVar4 = rn2(3);
        if ((iVar3 + -1 != 0) || (iVar4 + -1 != 0)) {
          buzz(-0xf,8,(xchar)iVar1,(xchar)iVar2,iVar3 + -1,iVar4 + -1);
        }
      }
    }
    if (level->locations[u.ux][u.uy].typ == '&') {
      pline("Kaboom!!!  Boom!!  Boom!!");
      if (((byte)u._1052_1_ >> 4 & 1) == 0) {
        stop_occupation();
        nomul(-3,"hiding from a thunderstorm");
      }
    }
    else {
      You_hear("a rumbling noise.");
    }
  }
  return;
}

Assistant:

void do_storms(void)
{
    int nstrike;
    int x, y;
    int dirx, diry;
    int count;

    /* no lightning if not stormy level or too often, even then */
    if (!level->flags.stormy || rn2(8))
	return;

    /* the number of strikes is 8-log2(nstrike) */
    for (nstrike = rnd(64); nstrike <= 64; nstrike *= 2) {
	count = 0;
	do {
	    x = rnd(COLNO-1);
	    y = rn2(ROWNO);
	} while (++count < 100 && level->locations[x][y].typ != CLOUD);

	if (count < 100) {
	    dirx = rn2(3) - 1;
	    diry = rn2(3) - 1;
	    if (dirx != 0 || diry != 0)
		buzz(-15, /* "monster" LIGHTNING spell */
		     8, x, y, dirx, diry);
	}
    }

    if (level->locations[u.ux][u.uy].typ == CLOUD) {
	/* inside a cloud during a thunder storm is deafening */
	pline("Kaboom!!!  Boom!!  Boom!!");
	if (!u.uinvulnerable) {
	    stop_occupation();
	    nomul(-3, "hiding from a thunderstorm");
	}
    } else
	You_hear("a rumbling noise.");
}